

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

int rngOneTest(char *sch,char *filename,int options,xmlRelaxNGPtr schemas)

{
  int iVar1;
  long lVar2;
  undefined8 uVar3;
  int ret;
  xmlRelaxNGValidCtxtPtr ctxt;
  xmlDocPtr doc;
  xmlRelaxNGPtr schemas_local;
  int options_local;
  char *filename_local;
  char *sch_local;
  
  lVar2 = xmlReadFile(filename,0,options);
  if (lVar2 == 0) {
    fprintf(_stderr,"failed to parse instance %s for %s\n",filename,sch);
    sch_local._4_4_ = -1;
  }
  else {
    uVar3 = xmlRelaxNGNewValidCtxt(schemas);
    xmlRelaxNGSetValidStructuredErrors(uVar3,testStructuredErrorHandler,0);
    iVar1 = xmlRelaxNGValidateDoc(uVar3,lVar2);
    if (iVar1 == 0) {
      testErrorHandler((void *)0x0,"%s validates\n",filename);
    }
    else if (iVar1 < 1) {
      testErrorHandler((void *)0x0,"%s validation generated an internal error\n",filename);
    }
    else {
      testErrorHandler((void *)0x0,"%s fails to validate\n",filename);
    }
    xmlRelaxNGFreeValidCtxt(uVar3);
    xmlFreeDoc(lVar2);
    sch_local._4_4_ = 0;
  }
  return sch_local._4_4_;
}

Assistant:

static int
rngOneTest(const char *sch,
               const char *filename,
	       int options,
	       xmlRelaxNGPtr schemas) {
    xmlDocPtr doc;
    xmlRelaxNGValidCtxtPtr ctxt;
    int ret = 0;

    doc = xmlReadFile(filename, NULL, options);
    if (doc == NULL) {
        fprintf(stderr, "failed to parse instance %s for %s\n", filename, sch);
	return(-1);
    }

    ctxt = xmlRelaxNGNewValidCtxt(schemas);
    xmlRelaxNGSetValidStructuredErrors(ctxt, testStructuredErrorHandler, NULL);
    ret = xmlRelaxNGValidateDoc(ctxt, doc);
    if (ret == 0) {
	testErrorHandler(NULL, "%s validates\n", filename);
    } else if (ret > 0) {
	testErrorHandler(NULL, "%s fails to validate\n", filename);
    } else {
	testErrorHandler(NULL, "%s validation generated an internal error\n",
	       filename);
    }

    xmlRelaxNGFreeValidCtxt(ctxt);
    xmlFreeDoc(doc);
    return(0);
}